

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuEmuD3D0::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuEmuD3D0 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar2;
  SingleMthdTest *this_01;
  result_type rVar3;
  Test *pTVar4;
  MthdDmaGrobj *this_02;
  MthdCtxSurf *pMVar5;
  MthdEmuD3D56TexOffset *this_03;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_469;
  Test *local_468;
  Test *local_460;
  Test *local_458;
  Test *local_450;
  Test *local_448;
  Test *local_440;
  Test *local_438;
  Test *local_430;
  MthdCtxSurf *local_428;
  Test *local_420;
  Test *local_418;
  Test *local_410;
  Test *local_408;
  MthdEmuD3D56TexOffset *local_400;
  MthdCtxSurf *local_3f8;
  MthdDmaGrobj *local_3f0;
  Test *local_3e8;
  Test *local_3e0;
  SingleMthdTest *local_3d8;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_3d0;
  undefined1 *local_3c8;
  long local_3c0;
  undefined1 local_3b8 [16];
  undefined1 *local_3a8;
  long local_3a0;
  undefined1 local_398 [16];
  undefined1 *local_388;
  long local_380;
  undefined1 local_378 [16];
  undefined1 *local_368;
  long local_360;
  undefined1 local_358 [16];
  undefined1 *local_348;
  long local_340;
  undefined1 local_338 [16];
  undefined1 *local_328;
  long local_320;
  undefined1 local_318 [16];
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8 [16];
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  undefined1 *local_268;
  long local_260;
  undefined1 local_258 [16];
  undefined1 *local_248;
  long local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  long local_220;
  undefined1 local_218 [16];
  undefined1 *local_208;
  long local_200;
  undefined1 local_1f8 [16];
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  SingleMthdTest *local_e8;
  Test *local_e0;
  Test *local_d8;
  Test *local_d0;
  MthdDmaGrobj *local_c8;
  Test *local_c0;
  MthdCtxSurf *local_b8;
  MthdCtxSurf *local_b0;
  Test *local_a8;
  MthdEmuD3D56TexOffset *local_a0;
  Test *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_3d8 = this_01;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"nop","");
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,opt,(uint32_t)rVar3);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this_01->name,local_188,local_188 + local_180);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_e8 = this_01;
  pTVar4 = (Test *)operator_new(0x25950);
  local_3e0 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1a8,local_1a8 + local_1a0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_e0 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_3e8 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"pm_trigger","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1c8,local_1c8 + local_1c0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_d8 = pTVar4;
  local_418 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e8 = local_1d8;
  local_3d0 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"dma_notify","");
  pTVar4 = local_418;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_418,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 1;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_1e8,local_1e8 + local_1e0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_d0 = pTVar4;
  this_02 = (MthdDmaGrobj *)operator_new(0x25960);
  local_3f0 = this_02;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"dma_tex","");
  MthdDmaGrobj::MthdDmaGrobj
            (this_02,opt,(uint32_t)rVar3,&local_108,2,(this->super_Class).cls,0x184,0,4);
  local_c8 = this_02;
  local_420 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"ctx_clip","");
  pTVar4 = local_420;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_420,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x188;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 3;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_208,local_208 + local_200);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349948;
  local_c0 = pTVar4;
  pMVar5 = (MthdCtxSurf *)operator_new(0x25958);
  local_3f8 = pMVar5;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"ctx_color","");
  MthdCtxSurf::MthdCtxSurf(pMVar5,opt,(uint32_t)rVar3,&local_128,4,(this->super_Class).cls,0x18c,2);
  local_b8 = pMVar5;
  local_428 = (MthdCtxSurf *)operator_new(0x25958);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"ctx_zeta","");
  pMVar5 = local_428;
  MthdCtxSurf::MthdCtxSurf(local_428,opt,(uint32_t)rVar3,&local_148,5,(this->super_Class).cls,400,3)
  ;
  local_b0 = pMVar5;
  local_430 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"missing","");
  pTVar4 = local_430;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_430,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 4;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_228,local_228 + local_220);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_a8 = pTVar4;
  this_03 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  local_400 = this_03;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"tex_offset","");
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (this_03,opt,(uint32_t)rVar3,&local_168,6,(this->super_Class).cls,0x304,3);
  local_a0 = this_03;
  local_438 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"tex_format","");
  pTVar4 = local_438;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_438,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x308;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 7;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_248,local_248 + local_240);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00358f58;
  local_98 = pTVar4;
  local_440 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"tex_filter","");
  pTVar4 = local_440;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_440,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x30c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 8;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_268,local_268 + local_260);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359050;
  local_90 = pTVar4;
  local_448 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"fog_color","");
  pTVar4 = local_448;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_448,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 9;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_288,local_288 + local_280);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359148;
  local_88 = pTVar4;
  local_450 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"config","");
  pTVar4 = local_450;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_450,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 10;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2a8,local_2a8 + local_2a0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359240;
  local_80 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_408 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"alpha","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2c8,local_2c8 + local_2c0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359338;
  local_78 = pTVar4;
  local_458 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"tlv_fog_tri","");
  pTVar4 = local_458;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_458,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1000;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_2e8,local_2e8 + local_2e0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359430;
  local_70 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  local_410 = pTVar4;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"tlv_color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1004;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_308,local_308 + local_300);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359528;
  local_68 = pTVar4;
  local_460 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"tlv_x","");
  pTVar4 = local_460;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_460,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1008;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xe;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_328,local_328 + local_320);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359620;
  local_60 = pTVar4;
  local_468 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"tlv_y","");
  pTVar4 = local_468;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_468,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x100c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_348,local_348 + local_340);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359718;
  local_58 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"tlv_z","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1010;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x10;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_368,local_368 + local_360);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359810;
  local_50 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"tlv_rhw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1014;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x11;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_388,local_388 + local_380);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359908;
  local_48 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25960);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"tlv_u","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x1018;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x12;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_3a8,local_3a8 + local_3a0);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar4[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar4[0x1e].rnd._M_x + 0x11a) = 0;
  local_40 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25960);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"tlv_v","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,opt,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x101c;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0x13;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_3c8,local_3c8 + local_3c0);
  pvVar2 = local_3d0;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00359a00;
  pTVar4[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar4[0x1e].rnd._M_x + 0x11a) = 1;
  __l._M_len = 0x17;
  __l._M_array = &local_e8;
  local_38 = pTVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_3d0,__l,&local_469);
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  if (local_348 != local_338) {
    operator_delete(local_348);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  return pvVar2;
}

Assistant:

std::vector<SingleMthdTest *> EmuEmuD3D0::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 3, cls, 0x188),
		new MthdCtxSurf(opt, rnd(), "ctx_color", 4, cls, 0x18c, 2),
		new MthdCtxSurf(opt, rnd(), "ctx_zeta", 5, cls, 0x190, 3),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 4),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_offset", 6, cls, 0x304, 3),
		new MthdEmuEmuD3D0TexFormat(opt, rnd(), "tex_format", 7, cls, 0x308),
		new MthdEmuEmuD3D0TexFilter(opt, rnd(), "tex_filter", 8, cls, 0x30c),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 9, cls, 0x310),
		new MthdEmuEmuD3D0Config(opt, rnd(), "config", 10, cls, 0x314),
		new MthdEmuEmuD3D0Alpha(opt, rnd(), "alpha", 11, cls, 0x318),
		new MthdEmuEmuD3D0TlvFogTri(opt, rnd(), "tlv_fog_tri", 12, cls, 0x1000, 0x80, 0x20),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 13, cls, 0x1004, 0x80, 0x20),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 14, cls, 0x1008, 0x80, 0x20),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 15, cls, 0x100c, 0x80, 0x20),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 16, cls, 0x1010, 0x80, 0x20),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 17, cls, 0x1014, 0x80, 0x20),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u", 18, cls, 0x1018, 0x80, 0x20, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v", 19, cls, 0x101c, 0x80, 0x20, 0, 1, true),
	};
}